

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQFunctionStateJAOHInterface.h
# Opt level: O0

double __thiscall
FactoredQFunctionStateJAOHInterface::GetLocalQValue
          (FactoredQFunctionStateJAOHInterface *this,Index e,Index stage,Index sfSC_sI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aoHistIs_e,Index jaI_e)

{
  undefined8 uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

virtual double GetLocalQValue(
            Index e, 
            Index stage,
            Index sfSC_sI,  
            const std::vector<Index>& aoHistIs_e, 
            Index jaI_e //joint group action index
    ) const 
    {
        throw E("FactoredQFunctionStateJAOHInterface::  double GetLocalQValue(\
            Index e, \
            Index stage,\
            Index sfSC_sI,\
            const std::vector<Index>& aoHistIs_e, \
            Index jaI_e) \
            should be overridden!");
    }